

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mesh.cpp
# Opt level: O0

void __thiscall Mesh::_drawList(Mesh *this)

{
  PFNGLNORMALPOINTERPROC p_Var1;
  PFNGLTEXCOORDPOINTERPROC p_Var2;
  PFNGLVERTEXPOINTERPROC p_Var3;
  reference pvVar4;
  Mesh *this_local;
  
  (*glad_glEnable)(0xde1);
  (*glad_glTexEnvf)(0x2300,0x2200,8448.0);
  (*glad_glBindTexture)(0xde1,this->_texture->id);
  (*glad_glEnableClientState)(0x8074);
  (*glad_glEnableClientState)(0x8075);
  (*glad_glEnableClientState)(0x8078);
  p_Var3 = glad_glVertexPointer;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&this->_meshData->vertices,0);
  (*p_Var3)(3,0x1406,0,pvVar4);
  p_Var2 = glad_glTexCoordPointer;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     (&this->_meshData->textureCoordinates,0);
  (*p_Var2)(2,0x1406,0,pvVar4);
  p_Var1 = glad_glNormalPointer;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&this->_meshData->normals,0);
  (*p_Var1)(0x1406,0,pvVar4);
  (*glad_glDrawArrays)(4,0,(GLsizei)this->_meshData->numVertices);
  (*glad_glDisableClientState)(0x8074);
  (*glad_glDisableClientState)(0x8075);
  (*glad_glDisableClientState)(0x8078);
  (*glad_glDisable)(0xde1);
  return;
}

Assistant:

void Mesh::_drawList() {
    // Enable texture
    glEnable(GL_TEXTURE_2D);
    glTexEnvf(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);
    glBindTexture(GL_TEXTURE_2D, _texture->id);

    // Draw the mesh
    glEnableClientState(GL_VERTEX_ARRAY); //enable vertex array
    glEnableClientState(GL_NORMAL_ARRAY); //enable normal array
    glEnableClientState(GL_TEXTURE_COORD_ARRAY); //enable texcoord array

    glVertexPointer(3, GL_FLOAT, 0, &_meshData->vertices[0]); //give vertex array to OGL
    glTexCoordPointer(2, GL_FLOAT, 0, &_meshData->textureCoordinates[0]); //same with texcoord array
    glNormalPointer(GL_FLOAT, 0, &_meshData->normals[0]); //and normal array

    glDrawArrays(GL_TRIANGLES, 0, (GLsizei)_meshData->numVertices);

    glDisableClientState(GL_VERTEX_ARRAY); //disable the client states again
    glDisableClientState(GL_NORMAL_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);

    glDisable(GL_TEXTURE_2D);
}